

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void util_tests::TestOtherProcess(path *dirname,path *lockname,int fd)

{
  void *__buf;
  LockResult LVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  char ch;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  sVar2 = read(fd,(void *)((long)&uStack_28 + 7),1);
  if ((int)sVar2 == 1) {
    __buf = (void *)((long)&uStack_28 + 7);
    do {
      if (uStack_28._7_1_ == 'L') {
        LVar1 = util::LockDirectory(dirname,lockname,false);
        if (ErrorLock < LVar1) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                        ,0x47c,
                        "auto util_tests::TestOtherProcess(fs::path, fs::path, int)::(anonymous class)::operator()() const"
                       );
        }
        uStack_28 = CONCAT17((char)LVar1 + '\x02',(undefined7)uStack_28);
        sVar2 = write(fd,__buf,1);
        if ((int)sVar2 != 1) {
          __assert_fail("rv == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                        ,0x47f,"void util_tests::TestOtherProcess(fs::path, fs::path, int)");
        }
      }
      else {
        if (uStack_28._7_1_ != 'U') {
          if (uStack_28._7_1_ == 'X') {
            close(fd);
            exit(0);
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                        ,0x48b,"void util_tests::TestOtherProcess(fs::path, fs::path, int)");
        }
        ReleaseDirectoryLocks();
        uStack_28 = CONCAT17(5,(undefined7)uStack_28);
        sVar2 = write(fd,__buf,1);
        if ((int)sVar2 != 1) {
          __assert_fail("rv == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                        ,0x485,"void util_tests::TestOtherProcess(fs::path, fs::path, int)");
        }
      }
      sVar2 = read(fd,__buf,1);
    } while ((int)sVar2 == 1);
  }
  __assert_fail("rv == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                ,0x473,"void util_tests::TestOtherProcess(fs::path, fs::path, int)");
}

Assistant:

[[noreturn]] static void TestOtherProcess(fs::path dirname, fs::path lockname, int fd)
{
    char ch;
    while (true) {
        int rv = read(fd, &ch, 1); // Wait for command
        assert(rv == 1);
        switch (ch) {
        case LockCommand:
            ch = [&] {
                switch (util::LockDirectory(dirname, lockname)) {
                case util::LockResult::Success: return ResSuccess;
                case util::LockResult::ErrorWrite: return ResErrorWrite;
                case util::LockResult::ErrorLock: return ResErrorLock;
                } // no default case, so the compiler can warn about missing cases
                assert(false);
            }();
            rv = write(fd, &ch, 1);
            assert(rv == 1);
            break;
        case UnlockCommand:
            ReleaseDirectoryLocks();
            ch = ResUnlockSuccess; // Always succeeds
            rv = write(fd, &ch, 1);
            assert(rv == 1);
            break;
        case ExitCommand:
            close(fd);
            exit(0);
        default:
            assert(0);
        }
    }
}